

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImGuiTabItem *tab;
  ImGuiTabItem *pIStack_18;
  int tab_n;
  ImGuiTabItem *most_recently_selected_tab;
  ImGuiTabBar *tab_bar_local;
  
  pIStack_18 = (ImGuiTabItem *)0x0;
  for (tab._4_4_ = 0; tab._4_4_ < (tab_bar->Tabs).Size; tab._4_4_ = tab._4_4_ + 1) {
    pIVar1 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab._4_4_);
    if ((((pIStack_18 == (ImGuiTabItem *)0x0) ||
         (pIStack_18->LastFrameSelected < pIVar1->LastFrameSelected)) &&
        (pIVar1->Window != (ImGuiWindow *)0x0)) && ((pIVar1->Window->WasActive & 1U) != 0)) {
      pIStack_18 = pIVar1;
    }
  }
  return pIStack_18;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* most_recently_selected_tab = NULL;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            if (tab->Window && tab->Window->WasActive)
                most_recently_selected_tab = tab;
    }
    return most_recently_selected_tab;
}